

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_tree_renderer.cpp
# Opt level: O3

yyjson_mut_val * duckdb::RenderRecursive(yyjson_mut_doc *doc,RenderTree *tree,idx_t x,idx_t y)

{
  yyjson_val_pool *pyVar1;
  yyjson_alc *alc;
  yyjson_str_pool *pool;
  pointer pCVar2;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  pointer ppVar6;
  pointer pbVar7;
  optional_ptr<duckdb::RenderTreeNode,_true> oVar8;
  bool bVar9;
  yyjson_mut_val *pyVar10;
  size_t sVar11;
  yyjson_mut_val *pyVar12;
  yyjson_mut_val *pyVar13;
  Coordinate *child_pos;
  pointer pCVar14;
  pointer ppVar15;
  yyjson_mut_val *pyVar16;
  char *pcVar17;
  yyjson_mut_val *pyVar18;
  pointer pbVar19;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  splits;
  string local_58;
  optional_ptr<duckdb::RenderTreeNode,_true> node_p;
  
  node_p = RenderTree::GetNode(tree,x,y);
  optional_ptr<duckdb::RenderTreeNode,_true>::CheckValid(&node_p);
  oVar8.ptr = node_p.ptr;
  if (doc == (yyjson_mut_doc *)0x0) {
    pyVar16 = (yyjson_mut_val *)0x0;
LAB_00ccd140:
    pyVar18 = (yyjson_mut_val *)0x0;
  }
  else {
    pyVar1 = &doc->val_pool;
    pyVar16 = (doc->val_pool).cur;
    if ((doc->val_pool).end == pyVar16) {
      bVar9 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,1);
      pyVar16 = (doc->val_pool).cur;
      pyVar18 = pyVar16;
      if (bVar9) goto LAB_00ccc8ad;
LAB_00ccd1a0:
      pyVar16 = (yyjson_mut_val *)0x0;
    }
    else {
LAB_00ccc8ad:
      pyVar18 = pyVar16 + 1;
      pyVar1->cur = pyVar18;
      if (pyVar16 == (yyjson_mut_val *)0x0) goto LAB_00ccd1a0;
      pyVar16->tag = 7;
    }
    if ((doc->val_pool).end == pyVar18) {
      bVar9 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,1);
      if (bVar9) {
        pyVar18 = pyVar1->cur;
        goto LAB_00ccc8cf;
      }
      pyVar18 = (yyjson_mut_val *)0x0;
    }
    else {
LAB_00ccc8cf:
      pyVar1->cur = pyVar18 + 1;
      if (pyVar18 == (yyjson_mut_val *)0x0) goto LAB_00ccd140;
      pyVar18->tag = 6;
    }
  }
  pCVar2 = ((oVar8.ptr)->child_positions).
           super_vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
           .
           super__Vector_base<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pCVar14 = ((oVar8.ptr)->child_positions).
                 super_vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                 .
                 super__Vector_base<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                 ._M_impl.super__Vector_impl_data._M_start; pCVar14 != pCVar2; pCVar14 = pCVar14 + 1
      ) {
    pyVar10 = RenderRecursive(doc,tree,pCVar14->x,pCVar14->y);
    if (((pyVar18 != (yyjson_mut_val *)0x0) && (pyVar10 != (yyjson_mut_val *)0x0)) &&
       (uVar3 = pyVar18->tag, ((uint)uVar3 & 7) == 6)) {
      pyVar18->tag = (uVar3 & 0xfffffffffffffffe) + 0x100;
      pyVar12 = pyVar10;
      if (0xff < uVar3) {
        pyVar12 = *(yyjson_mut_val **)((pyVar18->uni).u64 + 0x10);
        *(yyjson_mut_val **)((pyVar18->uni).u64 + 0x10) = pyVar10;
      }
      pyVar10->next = pyVar12;
      (pyVar18->uni).str = (char *)pyVar10;
    }
  }
  pcVar4 = ((oVar8.ptr)->name)._M_dataplus._M_p;
  if (pcVar4 == (char *)0x0) {
LAB_00ccca4f:
    if (pyVar18 == (yyjson_mut_val *)0x0) {
      if (doc != (yyjson_mut_doc *)0x0) goto LAB_00cccafb;
    }
    else if (doc != (yyjson_mut_doc *)0x0) {
      if ((pyVar16 != (yyjson_mut_val *)0x0) && ((~(uint)pyVar16->tag & 7) == 0)) {
        pyVar1 = &doc->val_pool;
        pyVar10 = (doc->val_pool).cur;
        if ((ulong)(((long)(doc->val_pool).end - (long)pyVar10) / 0x18) < 2) {
          bVar9 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,2);
          if (!bVar9) goto LAB_00cccafb;
          pyVar10 = pyVar1->cur;
        }
        pyVar1->cur = pyVar10 + 2;
        if (pyVar10 != (yyjson_mut_val *)0x0) {
          uVar3 = pyVar16->tag;
          pyVar10->tag = 0x80d;
          (pyVar10->uni).f64 = (double)"children";
          pyVar12 = pyVar10;
          if (0xff < uVar3) {
            lVar5 = *(long *)((pyVar16->uni).u64 + 0x10);
            pyVar12 = *(yyjson_mut_val **)(lVar5 + 0x10);
            *(yyjson_mut_val **)(lVar5 + 0x10) = pyVar10;
          }
          pyVar18->next = pyVar12;
          pyVar10->next = pyVar18;
          (pyVar16->uni).u64 = (uint64_t)pyVar10;
          pyVar16->tag = (uVar3 & 0xffffffffffffff00) + (ulong)(byte)pyVar16->tag + 0x100;
        }
      }
LAB_00cccafb:
      pyVar1 = &doc->val_pool;
      pyVar18 = (doc->val_pool).cur;
      if ((doc->val_pool).end == pyVar18) {
        bVar9 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,1);
        if (!bVar9) goto LAB_00ccd151;
        pyVar18 = pyVar1->cur;
      }
      pyVar1->cur = pyVar18 + 1;
      if (pyVar18 != (yyjson_mut_val *)0x0) {
        pyVar18->tag = 7;
        goto LAB_00cccb27;
      }
    }
  }
  else if (doc != (yyjson_mut_doc *)0x0) {
    if ((pyVar16 != (yyjson_mut_val *)0x0) && ((~(uint)pyVar16->tag & 7) == 0)) {
      pyVar1 = &doc->val_pool;
      pyVar10 = (doc->val_pool).cur;
      if ((ulong)(((long)(doc->val_pool).end - (long)pyVar10) / 0x18) < 2) {
        bVar9 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,2);
        if (!bVar9) goto LAB_00ccca4f;
        pyVar10 = pyVar1->cur;
      }
      pyVar1->cur = pyVar10 + 2;
      if (pyVar10 != (yyjson_mut_val *)0x0) {
        uVar3 = pyVar16->tag;
        pyVar10->tag = 0x40d;
        (pyVar10->uni).str = "name";
        sVar11 = strlen(pcVar4);
        pyVar10[1].tag = sVar11 << 8 | 5;
        pyVar10[1].uni.str = pcVar4;
        pyVar12 = pyVar10;
        if (0xff < uVar3) {
          lVar5 = *(long *)((pyVar16->uni).u64 + 0x10);
          pyVar12 = *(yyjson_mut_val **)(lVar5 + 0x10);
          *(yyjson_mut_val **)(lVar5 + 0x10) = pyVar10;
        }
        pyVar10[1].next = pyVar12;
        pyVar10->next = pyVar10 + 1;
        (pyVar16->uni).u64 = (uint64_t)pyVar10;
        pyVar16->tag = (ulong)(byte)pyVar16->tag + (uVar3 & 0xffffffffffffff00) + 0x100;
      }
    }
    goto LAB_00ccca4f;
  }
LAB_00ccd151:
  pyVar18 = (yyjson_mut_val *)0x0;
LAB_00cccb27:
  ppVar15 = ((oVar8.ptr)->extra_text).map.
            super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            .
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar6 = ((oVar8.ptr)->extra_text).map.
           super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           .
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar15 != ppVar6) {
    pyVar1 = &doc->val_pool;
    alc = &doc->alc;
    pool = &doc->str_pool;
    do {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,anon_var_dwarf_4f1835b + 8,anon_var_dwarf_4f1835b + 9);
      StringUtil::Split(&splits,(string *)&ppVar15->second,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      if ((ulong)((long)splits.
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)splits.
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
        if ((((doc != (yyjson_mut_doc *)0x0) && (pyVar18 != (yyjson_mut_val *)0x0)) &&
            (pcVar4 = (ppVar15->second)._M_dataplus._M_p, pcVar4 != (char *)0x0)) &&
           (((~(uint)pyVar18->tag & 7) == 0 &&
            (pcVar17 = (ppVar15->first)._M_dataplus._M_p, pcVar17 != (char *)0x0)))) {
          pyVar10 = (doc->val_pool).cur;
          if ((ulong)(((long)(doc->val_pool).end - (long)pyVar10) / 0x18) < 2) {
            bVar9 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,alc,2);
            if (!bVar9) goto LAB_00cccf8e;
            pyVar10 = pyVar1->cur;
          }
          pyVar1->cur = pyVar10 + 2;
          if (pyVar10 != (yyjson_mut_val *)0x0) {
            uVar3 = pyVar18->tag;
            pyVar10->tag = 5;
            sVar11 = strlen(pcVar17);
            pyVar10->tag = sVar11 << 8 | 5;
            (pyVar10->uni).str = pcVar17;
            sVar11 = strlen(pcVar4);
            pcVar17 = (doc->str_pool).cur;
            if (sVar11 < (ulong)((long)(doc->str_pool).end - (long)pcVar17)) {
LAB_00ccce26:
              pool->cur = pcVar17 + sVar11 + 1;
              if (pcVar17 != (char *)0x0) {
                switchD_012bc561::default(pcVar17,pcVar4,sVar11);
                pcVar17[sVar11] = '\0';
                pyVar10[1].uni.ptr = pcVar17;
                pyVar10[1].tag = sVar11 << 8 | 5;
                pyVar12 = pyVar10;
                if (0xff < uVar3) {
                  lVar5 = *(long *)((pyVar18->uni).u64 + 0x10);
                  pyVar12 = *(yyjson_mut_val **)(lVar5 + 0x10);
                  *(yyjson_mut_val **)(lVar5 + 0x10) = pyVar10;
                }
                pyVar10[1].next = pyVar12;
                pyVar10->next = pyVar10 + 1;
                (pyVar18->uni).str = (char *)pyVar10;
                pyVar18->tag = (uVar3 & 0xffffffffffffff00) + 0x100 + (ulong)(byte)pyVar18->tag;
                goto LAB_00cccf8e;
              }
            }
            else {
              bVar9 = duckdb_yyjson::unsafe_yyjson_str_pool_grow(pool,alc,sVar11 + 1);
              if (bVar9) {
                pcVar17 = pool->cur;
                goto LAB_00ccce26;
              }
            }
            pyVar10[1].uni.u64 = 0;
          }
        }
      }
      else {
        if (doc == (yyjson_mut_doc *)0x0) {
LAB_00cccfe4:
          pyVar10 = (yyjson_mut_val *)0x0;
        }
        else {
          pyVar10 = (doc->val_pool).cur;
          if ((doc->val_pool).end == pyVar10) {
            bVar9 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,alc,1);
            if (!bVar9) goto LAB_00cccfe4;
            pyVar10 = pyVar1->cur;
          }
          pyVar1->cur = pyVar10 + 1;
          if (pyVar10 == (yyjson_mut_val *)0x0) goto LAB_00cccfe4;
          pyVar10->tag = 6;
        }
        pbVar7 = splits.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (splits.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            splits.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pbVar19 = splits.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            if (((pyVar10 != (yyjson_mut_val *)0x0 && doc != (yyjson_mut_doc *)0x0) &&
                ((pyVar10->tag & 7) == 6)) &&
               (pcVar4 = (pbVar19->_M_dataplus)._M_p, pcVar4 != (char *)0x0)) {
              sVar11 = strlen(pcVar4);
              pyVar12 = (doc->val_pool).cur;
              if ((doc->val_pool).end == pyVar12) {
                bVar9 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,alc,1);
                if (bVar9) {
                  pyVar12 = pyVar1->cur;
                  goto LAB_00cccc6c;
                }
                pyVar12 = (yyjson_mut_val *)0x0;
              }
              else {
LAB_00cccc6c:
                pyVar1->cur = pyVar12 + 1;
              }
              pcVar17 = (doc->str_pool).cur;
              if ((ulong)((long)(doc->str_pool).end - (long)pcVar17) <= sVar11) {
                bVar9 = duckdb_yyjson::unsafe_yyjson_str_pool_grow(pool,alc,sVar11 + 1);
                if (!bVar9) goto LAB_00cccd04;
                pcVar17 = pool->cur;
              }
              pool->cur = pcVar17 + sVar11 + 1;
              if (pcVar17 != (char *)0x0) {
                switchD_012bc561::default(pcVar17,pcVar4,sVar11);
                pcVar17[sVar11] = '\0';
                if (pyVar12 != (yyjson_mut_val *)0x0) {
                  pyVar12->tag = sVar11 << 8 | 5;
                  (pyVar12->uni).ptr = pcVar17;
                  uVar3 = pyVar10->tag;
                  if (((uint)uVar3 & 7) == 6) {
                    pyVar10->tag = (uVar3 & 0xfffffffffffffffe) + 0x100;
                    pyVar13 = pyVar12;
                    if (0xff < uVar3) {
                      pyVar13 = *(yyjson_mut_val **)((pyVar10->uni).u64 + 0x10);
                      *(yyjson_mut_val **)((pyVar10->uni).u64 + 0x10) = pyVar12;
                    }
                    pyVar12->next = pyVar13;
                    (pyVar10->uni).str = (char *)pyVar12;
                  }
                }
              }
            }
LAB_00cccd04:
            pbVar19 = pbVar19 + 1;
          } while (pbVar19 != pbVar7);
        }
        if ((((doc != (yyjson_mut_doc *)0x0) && (pyVar18 != (yyjson_mut_val *)0x0)) &&
            (pyVar10 != (yyjson_mut_val *)0x0)) &&
           (((~(uint)pyVar18->tag & 7) == 0 &&
            (pcVar4 = (ppVar15->first)._M_dataplus._M_p, pcVar4 != (char *)0x0)))) {
          pyVar12 = (doc->val_pool).cur;
          if ((ulong)(((long)(doc->val_pool).end - (long)pyVar12) / 0x18) < 2) {
            bVar9 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,alc,2);
            if (!bVar9) goto LAB_00cccf8e;
            pyVar12 = pyVar1->cur;
          }
          pyVar1->cur = pyVar12 + 2;
          if (pyVar12 != (yyjson_mut_val *)0x0) {
            uVar3 = pyVar18->tag;
            pyVar12->tag = 5;
            sVar11 = strlen(pcVar4);
            pyVar12->tag = sVar11 << 8 | 5;
            (pyVar12->uni).str = pcVar4;
            pyVar13 = pyVar12;
            if (0xff < uVar3) {
              lVar5 = *(long *)((pyVar18->uni).u64 + 0x10);
              pyVar13 = *(yyjson_mut_val **)(lVar5 + 0x10);
              *(yyjson_mut_val **)(lVar5 + 0x10) = pyVar12;
            }
            pyVar10->next = pyVar13;
            pyVar12->next = pyVar10;
            (pyVar18->uni).str = (char *)pyVar12;
            pyVar18->tag = (ulong)(byte)pyVar18->tag + (uVar3 & 0xffffffffffffff00) + 0x100;
          }
        }
      }
LAB_00cccf8e:
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&splits);
      ppVar15 = ppVar15 + 1;
    } while (ppVar15 != ppVar6);
  }
  if (((doc != (yyjson_mut_doc *)0x0) && (pyVar16 != (yyjson_mut_val *)0x0)) &&
     ((pyVar18 != (yyjson_mut_val *)0x0 && ((~(uint)pyVar16->tag & 7) == 0)))) {
    pyVar1 = &doc->val_pool;
    pyVar10 = (doc->val_pool).cur;
    if ((ulong)(((long)(doc->val_pool).end - (long)pyVar10) / 0x18) < 2) {
      bVar9 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,2);
      if (!bVar9) {
        return pyVar16;
      }
      pyVar10 = pyVar1->cur;
    }
    pyVar1->cur = pyVar10 + 2;
    if (pyVar10 != (yyjson_mut_val *)0x0) {
      uVar3 = pyVar16->tag;
      pyVar10->tag = 0xa0d;
      (pyVar10->uni).f64 = (double)"extra_info";
      pyVar12 = pyVar10;
      if (0xff < uVar3) {
        lVar5 = *(long *)((pyVar16->uni).u64 + 0x10);
        pyVar12 = *(yyjson_mut_val **)(lVar5 + 0x10);
        *(yyjson_mut_val **)(lVar5 + 0x10) = pyVar10;
      }
      pyVar18->next = pyVar12;
      pyVar10->next = pyVar18;
      (pyVar16->uni).u64 = (uint64_t)pyVar10;
      pyVar16->tag = (uVar3 & 0xffffffffffffff00) + (ulong)(byte)pyVar16->tag + 0x100;
    }
  }
  return pyVar16;
}

Assistant:

static yyjson_mut_val *RenderRecursive(yyjson_mut_doc *doc, RenderTree &tree, idx_t x, idx_t y) {
	auto node_p = tree.GetNode(x, y);
	D_ASSERT(node_p);
	auto &node = *node_p;

	auto object = yyjson_mut_obj(doc);
	auto children = yyjson_mut_arr(doc);
	for (auto &child_pos : node.child_positions) {
		auto child_object = RenderRecursive(doc, tree, child_pos.x, child_pos.y);
		yyjson_mut_arr_append(children, child_object);
	}
	yyjson_mut_obj_add_str(doc, object, "name", node.name.c_str());
	yyjson_mut_obj_add_val(doc, object, "children", children);
	auto extra_info = yyjson_mut_obj(doc);
	for (auto &it : node.extra_text) {
		auto &key = it.first;
		auto &value = it.second;
		auto splits = StringUtil::Split(value, "\n");
		if (splits.size() > 1) {
			auto list_items = yyjson_mut_arr(doc);
			for (auto &split : splits) {
				yyjson_mut_arr_add_strcpy(doc, list_items, split.c_str());
			}
			yyjson_mut_obj_add_val(doc, extra_info, key.c_str(), list_items);
		} else {
			yyjson_mut_obj_add_strcpy(doc, extra_info, key.c_str(), value.c_str());
		}
	}
	yyjson_mut_obj_add_val(doc, object, "extra_info", extra_info);
	return object;
}